

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O3

void __thiscall
cnn::SumBatches::forward_impl
          (SumBatches *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx)

{
  pointer ppTVar1;
  Tensor *pTVar2;
  float *pfVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined8 uVar7;
  byte bVar8;
  byte bVar9;
  Index dstCols;
  Index dstRows;
  PointerType pfVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  Index index_1;
  ulong uVar16;
  uint uVar17;
  Index index_3;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  uint uVar23;
  ushort uVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  int iVar40;
  int iVar41;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> res;
  DstEvaluatorType dstEvaluator;
  SrcEvaluatorType srcEvaluator;
  add_assign_op<float,_float> local_11d;
  uint local_11c;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *local_118;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_110;
  PointerType local_f0;
  ulong local_e8;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>,_Eigen::internal::add_assign_op<float,_float>,_0>
  local_e0;
  DstEvaluatorType local_c0;
  undefined1 local_a8 [16];
  variable_if_dynamic<long,__1> local_98;
  float *local_90;
  variable_if_dynamic<long,__1> local_80;
  float *local_78;
  variable_if_dynamic<long,__1> local_68;
  float *local_60;
  variable_if_dynamic<long,__1> local_50;
  float *local_48;
  variable_if_dynamic<long,__1> local_38;
  
  ppTVar1 = (xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  local_118 = xs;
  if ((long)(xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1 != 8) {
    __assert_fail("xs.size() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/nodes.cc"
                  ,900,
                  "virtual void cnn::SumBatches::forward_impl(const vector<const Tensor *> &, Tensor &) const"
                 );
  }
  uVar11 = ((*ppTVar1)->d).bd;
  Tensor::operator*(&local_110,fx);
  pfVar10 = local_110.
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
            .
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
            .m_data;
  uVar23 = uVar11 & 3;
  local_11c = uVar11;
  switch(uVar23) {
  case 0:
    if ((local_110.
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_cols.m_value |
        local_110.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value) < 0) {
      __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                    ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, Eigen::Matrix<float, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<float>, MatrixType = Eigen::Matrix<float, -1, -1>]"
                   );
    }
    uVar15 = local_110.
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_cols.m_value *
             local_110.
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_rows.m_value;
    uVar16 = uVar15;
    if ((((ulong)local_110.
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 .
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_data & 3) == 0) &&
       (uVar16 = (ulong)(-((uint)((ulong)local_110.
                                         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                         .
                                         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                         .m_data >> 2) & 0x3fffffff) & 0xf),
       (long)uVar15 <= (long)uVar16)) {
      uVar16 = uVar15;
    }
    uVar22 = uVar15 - uVar16;
    uVar19 = uVar22 + 0xf;
    if (-1 < (long)uVar22) {
      uVar19 = uVar22;
    }
    local_e8 = uVar19 & 0xfffffffffffffff0;
    if (0 < (long)uVar16) {
      memset(local_110.
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_data,0,uVar16 * 4);
    }
    lVar18 = local_e8 + uVar16;
    if (0xf < (long)uVar22) {
      local_f0 = pfVar10;
      lVar13 = uVar16 + 0x10;
      if ((long)(uVar16 + 0x10) < lVar18) {
        lVar13 = lVar18;
      }
      memset(pfVar10 + uVar16,0,(~uVar16 + lVar13 & 0xfffffffffffffff0) * 4 + 0x40);
      pfVar10 = local_f0;
    }
    if (lVar18 < (long)uVar15) {
      memset(pfVar10 + ((long)uVar19 >> 4) * 0x10 + uVar16,0,(uVar22 - local_e8) * 4);
    }
    break;
  case 1:
    pTVar2 = *(local_118->
              super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>)._M_impl
              .super__Vector_impl_data._M_start;
    local_a8._0_8_ = pTVar2->v;
    local_a8._8_8_ = ZEXT48((pTVar2->d).d[0]);
    local_98.m_value = 1;
    if (1 < (pTVar2->d).nd) {
      local_98.m_value = (long)(pTVar2->d).d[1];
    }
    Eigen::MapBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
    ::operator=(&local_110.
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                ,(MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                  *)local_a8);
    break;
  case 2:
    pTVar2 = *(local_118->
              super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>)._M_impl
              .super__Vector_impl_data._M_start;
    uVar16 = (ulong)(pTVar2->d).d[0];
    uVar11 = (pTVar2->d).nd;
    if ((ulong)uVar11 == 0) {
      uVar14 = (pTVar2->d).bd;
      uVar11 = 1;
      uVar15 = 1;
    }
    else {
      auVar27 = vpbroadcastd_avx512f(ZEXT416(1));
      auVar28 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar29 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      uVar17 = (pTVar2->d).d[1];
      uVar14 = (pTVar2->d).bd;
      auVar30 = vpbroadcastq_avx512f();
      uVar15 = 0;
      do {
        auVar31 = vpbroadcastq_avx512f();
        auVar32 = vmovdqa64_avx512f(auVar27);
        auVar27 = vporq_avx512f(auVar31,auVar28);
        auVar31 = vporq_avx512f(auVar31,auVar29);
        uVar7 = vpcmpuq_avx512f(auVar31,auVar30,2);
        bVar8 = (byte)uVar7;
        uVar7 = vpcmpuq_avx512f(auVar27,auVar30,2);
        bVar9 = (byte)uVar7;
        uVar24 = CONCAT11(bVar9,bVar8);
        auVar27 = vmovdqu32_avx512f(*(undefined1 (*) [64])((pTVar2->d).d + uVar15));
        auVar26._4_4_ = (uint)((byte)(uVar24 >> 1) & 1) * auVar27._4_4_;
        auVar26._0_4_ = (uint)(bVar8 & 1) * auVar27._0_4_;
        auVar26._8_4_ = (uint)((byte)(uVar24 >> 2) & 1) * auVar27._8_4_;
        auVar26._12_4_ = (uint)((byte)(uVar24 >> 3) & 1) * auVar27._12_4_;
        auVar26._16_4_ = (uint)((byte)(uVar24 >> 4) & 1) * auVar27._16_4_;
        auVar26._20_4_ = (uint)((byte)(uVar24 >> 5) & 1) * auVar27._20_4_;
        auVar26._24_4_ = (uint)((byte)(uVar24 >> 6) & 1) * auVar27._24_4_;
        auVar26._28_4_ = (uint)((byte)(uVar24 >> 7) & 1) * auVar27._28_4_;
        auVar26._32_4_ = (uint)(bVar9 & 1) * auVar27._32_4_;
        auVar26._36_4_ = (uint)(bVar9 >> 1 & 1) * auVar27._36_4_;
        auVar26._40_4_ = (uint)(bVar9 >> 2 & 1) * auVar27._40_4_;
        auVar26._44_4_ = (uint)(bVar9 >> 3 & 1) * auVar27._44_4_;
        auVar26._48_4_ = (uint)(bVar9 >> 4 & 1) * auVar27._48_4_;
        auVar26._52_4_ = (uint)(bVar9 >> 5 & 1) * auVar27._52_4_;
        auVar26._56_4_ = (uint)(bVar9 >> 6 & 1) * auVar27._56_4_;
        auVar26._60_4_ = (uint)(bVar9 >> 7) * auVar27._60_4_;
        uVar15 = uVar15 + 0x10;
        auVar27 = vpmulld_avx512f(auVar26,auVar32);
      } while (((ulong)uVar11 + 0xf & 0xfffffffffffffff0) != uVar15);
      auVar27 = vmovdqa32_avx512f(auVar27);
      auVar29._0_4_ = (uint)(bVar8 & 1) * auVar27._0_4_ | (uint)!(bool)(bVar8 & 1) * auVar32._0_4_;
      bVar4 = (bool)((byte)(uVar24 >> 1) & 1);
      auVar29._4_4_ = (uint)bVar4 * auVar27._4_4_ | (uint)!bVar4 * auVar32._4_4_;
      bVar4 = (bool)((byte)(uVar24 >> 2) & 1);
      auVar29._8_4_ = (uint)bVar4 * auVar27._8_4_ | (uint)!bVar4 * auVar32._8_4_;
      bVar4 = (bool)((byte)(uVar24 >> 3) & 1);
      auVar29._12_4_ = (uint)bVar4 * auVar27._12_4_ | (uint)!bVar4 * auVar32._12_4_;
      bVar4 = (bool)((byte)(uVar24 >> 4) & 1);
      auVar29._16_4_ = (uint)bVar4 * auVar27._16_4_ | (uint)!bVar4 * auVar32._16_4_;
      bVar4 = (bool)((byte)(uVar24 >> 5) & 1);
      auVar29._20_4_ = (uint)bVar4 * auVar27._20_4_ | (uint)!bVar4 * auVar32._20_4_;
      bVar4 = (bool)((byte)(uVar24 >> 6) & 1);
      auVar29._24_4_ = (uint)bVar4 * auVar27._24_4_ | (uint)!bVar4 * auVar32._24_4_;
      bVar4 = (bool)((byte)(uVar24 >> 7) & 1);
      auVar29._28_4_ = (uint)bVar4 * auVar27._28_4_ | (uint)!bVar4 * auVar32._28_4_;
      auVar29._32_4_ =
           (uint)(bVar9 & 1) * auVar27._32_4_ | (uint)!(bool)(bVar9 & 1) * auVar32._32_4_;
      bVar4 = (bool)(bVar9 >> 1 & 1);
      auVar29._36_4_ = (uint)bVar4 * auVar27._36_4_ | (uint)!bVar4 * auVar32._36_4_;
      bVar4 = (bool)(bVar9 >> 2 & 1);
      auVar29._40_4_ = (uint)bVar4 * auVar27._40_4_ | (uint)!bVar4 * auVar32._40_4_;
      bVar4 = (bool)(bVar9 >> 3 & 1);
      auVar29._44_4_ = (uint)bVar4 * auVar27._44_4_ | (uint)!bVar4 * auVar32._44_4_;
      bVar4 = (bool)(bVar9 >> 4 & 1);
      auVar29._48_4_ = (uint)bVar4 * auVar27._48_4_ | (uint)!bVar4 * auVar32._48_4_;
      bVar4 = (bool)(bVar9 >> 5 & 1);
      auVar29._52_4_ = (uint)bVar4 * auVar27._52_4_ | (uint)!bVar4 * auVar32._52_4_;
      bVar4 = (bool)(bVar9 >> 6 & 1);
      auVar29._56_4_ = (uint)bVar4 * auVar27._56_4_ | (uint)!bVar4 * auVar32._56_4_;
      auVar29._60_4_ =
           (uint)(bVar9 >> 7) * auVar27._60_4_ | (uint)!(bool)(bVar9 >> 7) * auVar32._60_4_;
      auVar25 = vextracti64x4_avx512f(auVar29,1);
      auVar27 = vpmulld_avx512f(auVar29,ZEXT3264(auVar25));
      if (uVar11 == 1) {
        uVar17 = 1;
      }
      uVar15 = (ulong)uVar17;
      auVar5 = vpmulld_avx(auVar27._0_16_,auVar27._16_16_);
      auVar6 = vpshufd_avx(auVar5,0xee);
      auVar5 = vpmulld_avx(auVar5,auVar6);
      auVar6 = vpshufd_avx(auVar5,0x55);
      auVar5 = vpmulld_avx(auVar5,auVar6);
      uVar11 = auVar5._0_4_;
    }
    uVar19 = 0;
    if (uVar14 != 1) {
      uVar19 = (ulong)uVar11;
    }
    if ((local_110.
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_rows.m_value != uVar16) ||
       (local_110.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value != uVar15)) {
LAB_001bbe35:
      __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                    "void Eigen::DenseBase<Eigen::Map<Eigen::Matrix<float, -1, -1>>>::resize(Index, Index) [Derived = Eigen::Map<Eigen::Matrix<float, -1, -1>>]"
                   );
    }
    pfVar3 = pTVar2->v;
    uVar15 = uVar15 * uVar16;
    uVar16 = uVar15;
    if ((((ulong)local_110.
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 .
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_data & 3) == 0) &&
       (uVar16 = (ulong)(-((uint)((ulong)local_110.
                                         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                         .
                                         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                         .m_data >> 2) & 0x3fffffff) & 0xf), uVar15 <= uVar16)) {
      uVar16 = uVar15;
    }
    uVar20 = uVar15 - uVar16;
    uVar22 = uVar20 + 0xf;
    if (-1 < (long)uVar20) {
      uVar22 = uVar20;
    }
    if (uVar16 != 0) {
      uVar21 = 0;
      do {
        local_110.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data[uVar21] = pfVar3[uVar19 + uVar21] + pfVar3[uVar21];
        uVar21 = uVar21 + 1;
      } while (uVar16 != uVar21);
    }
    lVar18 = (uVar22 & 0xfffffffffffffff0) + uVar16;
    if (0xf < (long)uVar20) {
      do {
        auVar27 = vaddps_avx512f(*(undefined1 (*) [64])(pfVar3 + uVar19 + uVar16),
                                 *(undefined1 (*) [64])(pfVar3 + uVar16));
        *(undefined1 (*) [64])
         (local_110.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_data + uVar16) = auVar27;
        uVar16 = uVar16 + 0x10;
      } while ((long)uVar16 < lVar18);
    }
    if (lVar18 < (long)uVar15) {
      do {
        local_110.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data[lVar18] = pfVar3[uVar19 + lVar18] + pfVar3[lVar18];
        lVar18 = lVar18 + 1;
      } while (uVar15 - lVar18 != 0);
    }
    break;
  case 3:
    pTVar2 = *(local_118->
              super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>)._M_impl
              .super__Vector_impl_data._M_start;
    uVar16 = (ulong)(pTVar2->d).d[0];
    uVar15 = (ulong)(pTVar2->d).nd;
    if (uVar15 == 0) {
      uVar11 = (pTVar2->d).bd;
      iVar40 = 1;
      uVar15 = 1;
      uVar19 = (ulong)(uVar11 != 1);
    }
    else {
      uVar14 = 1;
      if (uVar15 != 1) {
        uVar14 = (pTVar2->d).d[1];
      }
      auVar27 = vpbroadcastd_avx512f(ZEXT416(1));
      auVar28 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar29 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      uVar11 = (pTVar2->d).bd;
      auVar30 = vpbroadcastq_avx512f();
      uVar19 = 0;
      do {
        auVar31 = vpbroadcastq_avx512f();
        auVar32 = vmovdqa64_avx512f(auVar27);
        auVar27 = vporq_avx512f(auVar31,auVar28);
        auVar31 = vporq_avx512f(auVar31,auVar29);
        uVar7 = vpcmpuq_avx512f(auVar31,auVar30,2);
        bVar8 = (byte)uVar7;
        uVar7 = vpcmpuq_avx512f(auVar27,auVar30,2);
        bVar9 = (byte)uVar7;
        uVar24 = CONCAT11(bVar9,bVar8);
        auVar31 = vmovdqu32_avx512f(*(undefined1 (*) [64])((pTVar2->d).d + uVar19));
        auVar27._4_4_ = (uint)((byte)(uVar24 >> 1) & 1) * auVar31._4_4_;
        auVar27._0_4_ = (uint)(bVar8 & 1) * auVar31._0_4_;
        auVar27._8_4_ = (uint)((byte)(uVar24 >> 2) & 1) * auVar31._8_4_;
        auVar27._12_4_ = (uint)((byte)(uVar24 >> 3) & 1) * auVar31._12_4_;
        auVar27._16_4_ = (uint)((byte)(uVar24 >> 4) & 1) * auVar31._16_4_;
        auVar27._20_4_ = (uint)((byte)(uVar24 >> 5) & 1) * auVar31._20_4_;
        auVar27._24_4_ = (uint)((byte)(uVar24 >> 6) & 1) * auVar31._24_4_;
        auVar27._28_4_ = (uint)((byte)(uVar24 >> 7) & 1) * auVar31._28_4_;
        auVar27._32_4_ = (uint)(bVar9 & 1) * auVar31._32_4_;
        auVar27._36_4_ = (uint)(bVar9 >> 1 & 1) * auVar31._36_4_;
        auVar27._40_4_ = (uint)(bVar9 >> 2 & 1) * auVar31._40_4_;
        auVar27._44_4_ = (uint)(bVar9 >> 3 & 1) * auVar31._44_4_;
        auVar27._48_4_ = (uint)(bVar9 >> 4 & 1) * auVar31._48_4_;
        auVar27._52_4_ = (uint)(bVar9 >> 5 & 1) * auVar31._52_4_;
        auVar27._56_4_ = (uint)(bVar9 >> 6 & 1) * auVar31._56_4_;
        auVar27._60_4_ = (uint)(bVar9 >> 7) * auVar31._60_4_;
        uVar19 = uVar19 + 0x10;
        auVar27 = vpmulld_avx512f(auVar27,auVar32);
      } while ((uVar15 + 0xf & 0xfffffffffffffff0) != uVar19);
      auVar27 = vmovdqa32_avx512f(auVar27);
      auVar31._0_4_ = (uint)(bVar8 & 1) * auVar27._0_4_ | (uint)!(bool)(bVar8 & 1) * auVar32._0_4_;
      bVar4 = (bool)((byte)(uVar24 >> 1) & 1);
      auVar31._4_4_ = (uint)bVar4 * auVar27._4_4_ | (uint)!bVar4 * auVar32._4_4_;
      bVar4 = (bool)((byte)(uVar24 >> 2) & 1);
      auVar31._8_4_ = (uint)bVar4 * auVar27._8_4_ | (uint)!bVar4 * auVar32._8_4_;
      bVar4 = (bool)((byte)(uVar24 >> 3) & 1);
      auVar31._12_4_ = (uint)bVar4 * auVar27._12_4_ | (uint)!bVar4 * auVar32._12_4_;
      bVar4 = (bool)((byte)(uVar24 >> 4) & 1);
      auVar31._16_4_ = (uint)bVar4 * auVar27._16_4_ | (uint)!bVar4 * auVar32._16_4_;
      bVar4 = (bool)((byte)(uVar24 >> 5) & 1);
      auVar31._20_4_ = (uint)bVar4 * auVar27._20_4_ | (uint)!bVar4 * auVar32._20_4_;
      bVar4 = (bool)((byte)(uVar24 >> 6) & 1);
      auVar31._24_4_ = (uint)bVar4 * auVar27._24_4_ | (uint)!bVar4 * auVar32._24_4_;
      bVar4 = (bool)((byte)(uVar24 >> 7) & 1);
      auVar31._28_4_ = (uint)bVar4 * auVar27._28_4_ | (uint)!bVar4 * auVar32._28_4_;
      auVar31._32_4_ =
           (uint)(bVar9 & 1) * auVar27._32_4_ | (uint)!(bool)(bVar9 & 1) * auVar32._32_4_;
      bVar4 = (bool)(bVar9 >> 1 & 1);
      auVar31._36_4_ = (uint)bVar4 * auVar27._36_4_ | (uint)!bVar4 * auVar32._36_4_;
      bVar4 = (bool)(bVar9 >> 2 & 1);
      auVar31._40_4_ = (uint)bVar4 * auVar27._40_4_ | (uint)!bVar4 * auVar32._40_4_;
      bVar4 = (bool)(bVar9 >> 3 & 1);
      auVar31._44_4_ = (uint)bVar4 * auVar27._44_4_ | (uint)!bVar4 * auVar32._44_4_;
      bVar4 = (bool)(bVar9 >> 4 & 1);
      auVar31._48_4_ = (uint)bVar4 * auVar27._48_4_ | (uint)!bVar4 * auVar32._48_4_;
      bVar4 = (bool)(bVar9 >> 5 & 1);
      auVar31._52_4_ = (uint)bVar4 * auVar27._52_4_ | (uint)!bVar4 * auVar32._52_4_;
      bVar4 = (bool)(bVar9 >> 6 & 1);
      auVar31._56_4_ = (uint)bVar4 * auVar27._56_4_ | (uint)!bVar4 * auVar32._56_4_;
      auVar31._60_4_ =
           (uint)(bVar9 >> 7) * auVar27._60_4_ | (uint)!(bool)(bVar9 >> 7) * auVar32._60_4_;
      auVar25 = vextracti64x4_avx512f(auVar31,1);
      uVar19 = 0;
      auVar27 = vpmulld_avx512f(auVar31,ZEXT3264(auVar25));
      auVar5 = vpmulld_avx(auVar27._0_16_,auVar27._16_16_);
      auVar6 = vpshufd_avx(auVar5,0xee);
      auVar5 = vpmulld_avx(auVar5,auVar6);
      auVar6 = vpshufd_avx(auVar5,0x55);
      auVar5 = vpmulld_avx(auVar5,auVar6);
      auVar27 = vpbroadcastd_avx512f(ZEXT416(1));
      uVar17 = auVar5._0_4_;
      if (uVar11 == 1) {
        uVar17 = 0;
      }
      do {
        auVar31 = vpbroadcastq_avx512f();
        auVar32 = vmovdqa64_avx512f(auVar27);
        auVar27 = vporq_avx512f(auVar31,auVar28);
        auVar31 = vporq_avx512f(auVar31,auVar29);
        uVar7 = vpcmpuq_avx512f(auVar31,auVar30,2);
        bVar8 = (byte)uVar7;
        uVar7 = vpcmpuq_avx512f(auVar27,auVar30,2);
        bVar9 = (byte)uVar7;
        uVar24 = CONCAT11(bVar9,bVar8);
        auVar27 = vmovdqu32_avx512f(*(undefined1 (*) [64])((pTVar2->d).d + uVar19));
        auVar33._4_4_ = (uint)((byte)(uVar24 >> 1) & 1) * auVar27._4_4_;
        auVar33._0_4_ = (uint)(bVar8 & 1) * auVar27._0_4_;
        auVar33._8_4_ = (uint)((byte)(uVar24 >> 2) & 1) * auVar27._8_4_;
        auVar33._12_4_ = (uint)((byte)(uVar24 >> 3) & 1) * auVar27._12_4_;
        auVar33._16_4_ = (uint)((byte)(uVar24 >> 4) & 1) * auVar27._16_4_;
        auVar33._20_4_ = (uint)((byte)(uVar24 >> 5) & 1) * auVar27._20_4_;
        auVar33._24_4_ = (uint)((byte)(uVar24 >> 6) & 1) * auVar27._24_4_;
        auVar33._28_4_ = (uint)((byte)(uVar24 >> 7) & 1) * auVar27._28_4_;
        auVar33._32_4_ = (uint)(bVar9 & 1) * auVar27._32_4_;
        auVar33._36_4_ = (uint)(bVar9 >> 1 & 1) * auVar27._36_4_;
        auVar33._40_4_ = (uint)(bVar9 >> 2 & 1) * auVar27._40_4_;
        auVar33._44_4_ = (uint)(bVar9 >> 3 & 1) * auVar27._44_4_;
        auVar33._48_4_ = (uint)(bVar9 >> 4 & 1) * auVar27._48_4_;
        auVar33._52_4_ = (uint)(bVar9 >> 5 & 1) * auVar27._52_4_;
        auVar33._56_4_ = (uint)(bVar9 >> 6 & 1) * auVar27._56_4_;
        auVar33._60_4_ = (uint)(bVar9 >> 7) * auVar27._60_4_;
        uVar19 = uVar19 + 0x10;
        auVar27 = vpmulld_avx512f(auVar33,auVar32);
      } while ((uVar15 + 0xf & 0x1fffffff0) != uVar19);
      auVar27 = vmovdqa32_avx512f(auVar27);
      auVar28._0_4_ = (uint)(bVar8 & 1) * auVar27._0_4_ | (uint)!(bool)(bVar8 & 1) * auVar32._0_4_;
      bVar4 = (bool)((byte)(uVar24 >> 1) & 1);
      auVar28._4_4_ = (uint)bVar4 * auVar27._4_4_ | (uint)!bVar4 * auVar32._4_4_;
      bVar4 = (bool)((byte)(uVar24 >> 2) & 1);
      auVar28._8_4_ = (uint)bVar4 * auVar27._8_4_ | (uint)!bVar4 * auVar32._8_4_;
      bVar4 = (bool)((byte)(uVar24 >> 3) & 1);
      auVar28._12_4_ = (uint)bVar4 * auVar27._12_4_ | (uint)!bVar4 * auVar32._12_4_;
      bVar4 = (bool)((byte)(uVar24 >> 4) & 1);
      auVar28._16_4_ = (uint)bVar4 * auVar27._16_4_ | (uint)!bVar4 * auVar32._16_4_;
      bVar4 = (bool)((byte)(uVar24 >> 5) & 1);
      auVar28._20_4_ = (uint)bVar4 * auVar27._20_4_ | (uint)!bVar4 * auVar32._20_4_;
      bVar4 = (bool)((byte)(uVar24 >> 6) & 1);
      auVar28._24_4_ = (uint)bVar4 * auVar27._24_4_ | (uint)!bVar4 * auVar32._24_4_;
      bVar4 = (bool)((byte)(uVar24 >> 7) & 1);
      auVar28._28_4_ = (uint)bVar4 * auVar27._28_4_ | (uint)!bVar4 * auVar32._28_4_;
      auVar28._32_4_ =
           (uint)(bVar9 & 1) * auVar27._32_4_ | (uint)!(bool)(bVar9 & 1) * auVar32._32_4_;
      bVar4 = (bool)(bVar9 >> 1 & 1);
      auVar28._36_4_ = (uint)bVar4 * auVar27._36_4_ | (uint)!bVar4 * auVar32._36_4_;
      bVar4 = (bool)(bVar9 >> 2 & 1);
      auVar28._40_4_ = (uint)bVar4 * auVar27._40_4_ | (uint)!bVar4 * auVar32._40_4_;
      bVar4 = (bool)(bVar9 >> 3 & 1);
      auVar28._44_4_ = (uint)bVar4 * auVar27._44_4_ | (uint)!bVar4 * auVar32._44_4_;
      bVar4 = (bool)(bVar9 >> 4 & 1);
      auVar28._48_4_ = (uint)bVar4 * auVar27._48_4_ | (uint)!bVar4 * auVar32._48_4_;
      bVar4 = (bool)(bVar9 >> 5 & 1);
      auVar28._52_4_ = (uint)bVar4 * auVar27._52_4_ | (uint)!bVar4 * auVar32._52_4_;
      bVar4 = (bool)(bVar9 >> 6 & 1);
      auVar28._56_4_ = (uint)bVar4 * auVar27._56_4_ | (uint)!bVar4 * auVar32._56_4_;
      auVar28._60_4_ =
           (uint)(bVar9 >> 7) * auVar27._60_4_ | (uint)!(bool)(bVar9 >> 7) * auVar32._60_4_;
      auVar25 = vextracti64x4_avx512f(auVar28,1);
      uVar15 = (ulong)uVar14;
      uVar19 = (ulong)uVar17;
      auVar27 = vpmulld_avx512f(auVar28,ZEXT3264(auVar25));
      auVar5 = vpmulld_avx(auVar27._0_16_,auVar27._16_16_);
      auVar6 = vpshufd_avx(auVar5,0xee);
      auVar5 = vpmulld_avx(auVar5,auVar6);
      auVar6 = vpshufd_avx(auVar5,0x55);
      auVar5 = vpmulld_avx(auVar5,auVar6);
      iVar40 = auVar5._0_4_;
    }
    if ((local_110.
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_rows.m_value != uVar16) ||
       (local_110.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value != uVar15)) goto LAB_001bbe35;
    pfVar3 = pTVar2->v;
    uVar15 = uVar15 * uVar16;
    uVar11 = (int)(2 % (ulong)uVar11) * iVar40;
    uVar16 = uVar15;
    if ((((ulong)local_110.
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 .
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_data & 3) == 0) &&
       (uVar16 = (ulong)(-((uint)((ulong)local_110.
                                         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                         .
                                         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                         .m_data >> 2) & 0x3fffffff) & 0xf), uVar15 <= uVar16)) {
      uVar16 = uVar15;
    }
    uVar20 = uVar15 - uVar16;
    uVar22 = uVar20 + 0xf;
    if (-1 < (long)uVar20) {
      uVar22 = uVar20;
    }
    if (uVar16 != 0) {
      uVar21 = 0;
      do {
        local_110.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data[uVar21] = pfVar3[uVar19 + uVar21] + pfVar3[uVar21] + pfVar3[uVar11 + uVar21];
        uVar21 = uVar21 + 1;
      } while (uVar16 != uVar21);
    }
    lVar18 = (uVar22 & 0xfffffffffffffff0) + uVar16;
    if (0xf < (long)uVar20) {
      do {
        auVar27 = vaddps_avx512f(*(undefined1 (*) [64])(pfVar3 + uVar19 + uVar16),
                                 *(undefined1 (*) [64])(pfVar3 + uVar16));
        auVar27 = vaddps_avx512f(auVar27,*(undefined1 (*) [64])(pfVar3 + uVar11 + uVar16));
        *(undefined1 (*) [64])
         (local_110.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_data + uVar16) = auVar27;
        uVar16 = uVar16 + 0x10;
      } while ((long)uVar16 < lVar18);
    }
    if (lVar18 < (long)uVar15) {
      do {
        local_110.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data[lVar18] = pfVar3[uVar19 + lVar18] + pfVar3[lVar18] + pfVar3[(ulong)uVar11 + lVar18];
        lVar18 = lVar18 + 1;
      } while (uVar15 - lVar18 != 0);
    }
  }
  if (3 < local_11c) {
    auVar27 = vpbroadcastd_avx512f(ZEXT416(1));
    auVar28 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar29 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      iVar40 = 1;
      pTVar2 = *(local_118->
                super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      uVar11 = (pTVar2->d).nd;
      uVar16 = (ulong)uVar11;
      if (uVar16 != 0) {
        auVar30 = vmovdqa64_avx512f(auVar27);
        auVar31 = vpbroadcastq_avx512f();
        uVar15 = 0;
        do {
          auVar32 = vpbroadcastq_avx512f();
          auVar33 = vmovdqa64_avx512f(auVar30);
          auVar30 = vporq_avx512f(auVar32,auVar28);
          auVar32 = vporq_avx512f(auVar32,auVar29);
          uVar7 = vpcmpuq_avx512f(auVar32,auVar31,2);
          bVar8 = (byte)uVar7;
          uVar7 = vpcmpuq_avx512f(auVar30,auVar31,2);
          bVar9 = (byte)uVar7;
          uVar24 = CONCAT11(bVar9,bVar8);
          auVar30 = vmovdqu32_avx512f(*(undefined1 (*) [64])((pTVar2->d).d + uVar15));
          auVar32._4_4_ = (uint)((byte)(uVar24 >> 1) & 1) * auVar30._4_4_;
          auVar32._0_4_ = (uint)(bVar8 & 1) * auVar30._0_4_;
          auVar32._8_4_ = (uint)((byte)(uVar24 >> 2) & 1) * auVar30._8_4_;
          auVar32._12_4_ = (uint)((byte)(uVar24 >> 3) & 1) * auVar30._12_4_;
          auVar32._16_4_ = (uint)((byte)(uVar24 >> 4) & 1) * auVar30._16_4_;
          auVar32._20_4_ = (uint)((byte)(uVar24 >> 5) & 1) * auVar30._20_4_;
          auVar32._24_4_ = (uint)((byte)(uVar24 >> 6) & 1) * auVar30._24_4_;
          auVar32._28_4_ = (uint)((byte)(uVar24 >> 7) & 1) * auVar30._28_4_;
          auVar32._32_4_ = (uint)(bVar9 & 1) * auVar30._32_4_;
          auVar32._36_4_ = (uint)(bVar9 >> 1 & 1) * auVar30._36_4_;
          auVar32._40_4_ = (uint)(bVar9 >> 2 & 1) * auVar30._40_4_;
          auVar32._44_4_ = (uint)(bVar9 >> 3 & 1) * auVar30._44_4_;
          auVar32._48_4_ = (uint)(bVar9 >> 4 & 1) * auVar30._48_4_;
          auVar32._52_4_ = (uint)(bVar9 >> 5 & 1) * auVar30._52_4_;
          auVar32._56_4_ = (uint)(bVar9 >> 6 & 1) * auVar30._56_4_;
          auVar32._60_4_ = (uint)(bVar9 >> 7) * auVar30._60_4_;
          uVar15 = uVar15 + 0x10;
          auVar30 = vpmulld_avx512f(auVar32,auVar33);
        } while ((uVar16 + 0xf & 0x1fffffff0) != uVar15);
        auVar30 = vmovdqa32_avx512f(auVar30);
        auVar34._0_4_ = (uint)(bVar8 & 1) * auVar30._0_4_ | (uint)!(bool)(bVar8 & 1) * auVar33._0_4_
        ;
        bVar4 = (bool)((byte)(uVar24 >> 1) & 1);
        auVar34._4_4_ = (uint)bVar4 * auVar30._4_4_ | (uint)!bVar4 * auVar33._4_4_;
        bVar4 = (bool)((byte)(uVar24 >> 2) & 1);
        auVar34._8_4_ = (uint)bVar4 * auVar30._8_4_ | (uint)!bVar4 * auVar33._8_4_;
        bVar4 = (bool)((byte)(uVar24 >> 3) & 1);
        auVar34._12_4_ = (uint)bVar4 * auVar30._12_4_ | (uint)!bVar4 * auVar33._12_4_;
        bVar4 = (bool)((byte)(uVar24 >> 4) & 1);
        auVar34._16_4_ = (uint)bVar4 * auVar30._16_4_ | (uint)!bVar4 * auVar33._16_4_;
        bVar4 = (bool)((byte)(uVar24 >> 5) & 1);
        auVar34._20_4_ = (uint)bVar4 * auVar30._20_4_ | (uint)!bVar4 * auVar33._20_4_;
        bVar4 = (bool)((byte)(uVar24 >> 6) & 1);
        auVar34._24_4_ = (uint)bVar4 * auVar30._24_4_ | (uint)!bVar4 * auVar33._24_4_;
        bVar4 = (bool)((byte)(uVar24 >> 7) & 1);
        auVar34._28_4_ = (uint)bVar4 * auVar30._28_4_ | (uint)!bVar4 * auVar33._28_4_;
        auVar34._32_4_ =
             (uint)(bVar9 & 1) * auVar30._32_4_ | (uint)!(bool)(bVar9 & 1) * auVar33._32_4_;
        bVar4 = (bool)(bVar9 >> 1 & 1);
        auVar34._36_4_ = (uint)bVar4 * auVar30._36_4_ | (uint)!bVar4 * auVar33._36_4_;
        bVar4 = (bool)(bVar9 >> 2 & 1);
        auVar34._40_4_ = (uint)bVar4 * auVar30._40_4_ | (uint)!bVar4 * auVar33._40_4_;
        bVar4 = (bool)(bVar9 >> 3 & 1);
        auVar34._44_4_ = (uint)bVar4 * auVar30._44_4_ | (uint)!bVar4 * auVar33._44_4_;
        bVar4 = (bool)(bVar9 >> 4 & 1);
        auVar34._48_4_ = (uint)bVar4 * auVar30._48_4_ | (uint)!bVar4 * auVar33._48_4_;
        bVar4 = (bool)(bVar9 >> 5 & 1);
        auVar34._52_4_ = (uint)bVar4 * auVar30._52_4_ | (uint)!bVar4 * auVar33._52_4_;
        bVar4 = (bool)(bVar9 >> 6 & 1);
        auVar34._56_4_ = (uint)bVar4 * auVar30._56_4_ | (uint)!bVar4 * auVar33._56_4_;
        auVar34._60_4_ =
             (uint)(bVar9 >> 7) * auVar30._60_4_ | (uint)!(bool)(bVar9 >> 7) * auVar33._60_4_;
        auVar25 = vextracti64x4_avx512f(auVar34,1);
        auVar30 = vpmulld_avx512f(auVar34,ZEXT3264(auVar25));
        auVar5 = vpmulld_avx(auVar30._0_16_,auVar30._16_16_);
        auVar6 = vpshufd_avx(auVar5,0xee);
        auVar5 = vpmulld_avx(auVar5,auVar6);
        auVar6 = vpshufd_avx(auVar5,0x55);
        auVar5 = vpmulld_avx(auVar5,auVar6);
        iVar40 = auVar5._0_4_;
      }
      uVar14 = (pTVar2->d).bd;
      local_48 = pTVar2->v;
      local_80.m_value = (long)(pTVar2->d).d[0];
      uVar17 = (pTVar2->d).d[1];
      if (uVar11 < 2) {
        uVar17 = 1;
      }
      if (uVar16 == 0) {
        uVar11 = (uVar23 + 1) % uVar14;
        iVar41 = 1;
        uVar12 = (uVar23 + 2) % uVar14;
      }
      else {
        uVar15 = 0;
        auVar30 = vmovdqa64_avx512f(auVar27);
        uVar16 = uVar16 + 0xf & 0x1fffffff0;
        auVar31 = vpbroadcastq_avx512f();
        do {
          auVar32 = vpbroadcastq_avx512f();
          auVar33 = vmovdqa64_avx512f(auVar30);
          auVar30 = vporq_avx512f(auVar32,auVar28);
          auVar32 = vporq_avx512f(auVar32,auVar29);
          uVar7 = vpcmpuq_avx512f(auVar32,auVar31,2);
          bVar8 = (byte)uVar7;
          uVar7 = vpcmpuq_avx512f(auVar30,auVar31,2);
          bVar9 = (byte)uVar7;
          uVar24 = CONCAT11(bVar9,bVar8);
          auVar30 = vmovdqu32_avx512f(*(undefined1 (*) [64])((pTVar2->d).d + uVar15));
          auVar35._4_4_ = (uint)((byte)(uVar24 >> 1) & 1) * auVar30._4_4_;
          auVar35._0_4_ = (uint)(bVar8 & 1) * auVar30._0_4_;
          auVar35._8_4_ = (uint)((byte)(uVar24 >> 2) & 1) * auVar30._8_4_;
          auVar35._12_4_ = (uint)((byte)(uVar24 >> 3) & 1) * auVar30._12_4_;
          auVar35._16_4_ = (uint)((byte)(uVar24 >> 4) & 1) * auVar30._16_4_;
          auVar35._20_4_ = (uint)((byte)(uVar24 >> 5) & 1) * auVar30._20_4_;
          auVar35._24_4_ = (uint)((byte)(uVar24 >> 6) & 1) * auVar30._24_4_;
          auVar35._28_4_ = (uint)((byte)(uVar24 >> 7) & 1) * auVar30._28_4_;
          auVar35._32_4_ = (uint)(bVar9 & 1) * auVar30._32_4_;
          auVar35._36_4_ = (uint)(bVar9 >> 1 & 1) * auVar30._36_4_;
          auVar35._40_4_ = (uint)(bVar9 >> 2 & 1) * auVar30._40_4_;
          auVar35._44_4_ = (uint)(bVar9 >> 3 & 1) * auVar30._44_4_;
          auVar35._48_4_ = (uint)(bVar9 >> 4 & 1) * auVar30._48_4_;
          auVar35._52_4_ = (uint)(bVar9 >> 5 & 1) * auVar30._52_4_;
          auVar35._56_4_ = (uint)(bVar9 >> 6 & 1) * auVar30._56_4_;
          auVar35._60_4_ = (uint)(bVar9 >> 7) * auVar30._60_4_;
          uVar15 = uVar15 + 0x10;
          auVar30 = vpmulld_avx512f(auVar35,auVar33);
        } while (uVar16 != uVar15);
        auVar30 = vmovdqa32_avx512f(auVar30);
        auVar36._0_4_ = (uint)(bVar8 & 1) * auVar30._0_4_ | (uint)!(bool)(bVar8 & 1) * auVar33._0_4_
        ;
        bVar4 = (bool)((byte)(uVar24 >> 1) & 1);
        auVar36._4_4_ = (uint)bVar4 * auVar30._4_4_ | (uint)!bVar4 * auVar33._4_4_;
        bVar4 = (bool)((byte)(uVar24 >> 2) & 1);
        auVar36._8_4_ = (uint)bVar4 * auVar30._8_4_ | (uint)!bVar4 * auVar33._8_4_;
        bVar4 = (bool)((byte)(uVar24 >> 3) & 1);
        auVar36._12_4_ = (uint)bVar4 * auVar30._12_4_ | (uint)!bVar4 * auVar33._12_4_;
        bVar4 = (bool)((byte)(uVar24 >> 4) & 1);
        auVar36._16_4_ = (uint)bVar4 * auVar30._16_4_ | (uint)!bVar4 * auVar33._16_4_;
        bVar4 = (bool)((byte)(uVar24 >> 5) & 1);
        auVar36._20_4_ = (uint)bVar4 * auVar30._20_4_ | (uint)!bVar4 * auVar33._20_4_;
        bVar4 = (bool)((byte)(uVar24 >> 6) & 1);
        auVar36._24_4_ = (uint)bVar4 * auVar30._24_4_ | (uint)!bVar4 * auVar33._24_4_;
        bVar4 = (bool)((byte)(uVar24 >> 7) & 1);
        auVar36._28_4_ = (uint)bVar4 * auVar30._28_4_ | (uint)!bVar4 * auVar33._28_4_;
        auVar36._32_4_ =
             (uint)(bVar9 & 1) * auVar30._32_4_ | (uint)!(bool)(bVar9 & 1) * auVar33._32_4_;
        bVar4 = (bool)(bVar9 >> 1 & 1);
        auVar36._36_4_ = (uint)bVar4 * auVar30._36_4_ | (uint)!bVar4 * auVar33._36_4_;
        bVar4 = (bool)(bVar9 >> 2 & 1);
        auVar36._40_4_ = (uint)bVar4 * auVar30._40_4_ | (uint)!bVar4 * auVar33._40_4_;
        bVar4 = (bool)(bVar9 >> 3 & 1);
        auVar36._44_4_ = (uint)bVar4 * auVar30._44_4_ | (uint)!bVar4 * auVar33._44_4_;
        bVar4 = (bool)(bVar9 >> 4 & 1);
        auVar36._48_4_ = (uint)bVar4 * auVar30._48_4_ | (uint)!bVar4 * auVar33._48_4_;
        bVar4 = (bool)(bVar9 >> 5 & 1);
        auVar36._52_4_ = (uint)bVar4 * auVar30._52_4_ | (uint)!bVar4 * auVar33._52_4_;
        bVar4 = (bool)(bVar9 >> 6 & 1);
        auVar36._56_4_ = (uint)bVar4 * auVar30._56_4_ | (uint)!bVar4 * auVar33._56_4_;
        auVar36._60_4_ =
             (uint)(bVar9 >> 7) * auVar30._60_4_ | (uint)!(bool)(bVar9 >> 7) * auVar33._60_4_;
        auVar25 = vextracti64x4_avx512f(auVar36,1);
        auVar30 = vpmulld_avx512f(auVar36,ZEXT3264(auVar25));
        auVar5 = vpmulld_avx(auVar30._0_16_,auVar30._16_16_);
        auVar6 = vpshufd_avx(auVar5,0xee);
        auVar5 = vpmulld_avx(auVar5,auVar6);
        auVar6 = vpshufd_avx(auVar5,0x55);
        auVar5 = vpmulld_avx(auVar5,auVar6);
        uVar15 = 0;
        auVar30 = vmovdqa64_avx512f(auVar27);
        uVar11 = ((uVar23 + 1) % uVar14) * auVar5._0_4_;
        do {
          auVar32 = vpbroadcastq_avx512f();
          auVar33 = vmovdqa64_avx512f(auVar30);
          auVar30 = vporq_avx512f(auVar32,auVar28);
          auVar32 = vporq_avx512f(auVar32,auVar29);
          uVar7 = vpcmpuq_avx512f(auVar32,auVar31,2);
          bVar8 = (byte)uVar7;
          uVar7 = vpcmpuq_avx512f(auVar30,auVar31,2);
          bVar9 = (byte)uVar7;
          uVar24 = CONCAT11(bVar9,bVar8);
          auVar30 = vmovdqu32_avx512f(*(undefined1 (*) [64])((pTVar2->d).d + uVar15));
          auVar37._4_4_ = (uint)((byte)(uVar24 >> 1) & 1) * auVar30._4_4_;
          auVar37._0_4_ = (uint)(bVar8 & 1) * auVar30._0_4_;
          auVar37._8_4_ = (uint)((byte)(uVar24 >> 2) & 1) * auVar30._8_4_;
          auVar37._12_4_ = (uint)((byte)(uVar24 >> 3) & 1) * auVar30._12_4_;
          auVar37._16_4_ = (uint)((byte)(uVar24 >> 4) & 1) * auVar30._16_4_;
          auVar37._20_4_ = (uint)((byte)(uVar24 >> 5) & 1) * auVar30._20_4_;
          auVar37._24_4_ = (uint)((byte)(uVar24 >> 6) & 1) * auVar30._24_4_;
          auVar37._28_4_ = (uint)((byte)(uVar24 >> 7) & 1) * auVar30._28_4_;
          auVar37._32_4_ = (uint)(bVar9 & 1) * auVar30._32_4_;
          auVar37._36_4_ = (uint)(bVar9 >> 1 & 1) * auVar30._36_4_;
          auVar37._40_4_ = (uint)(bVar9 >> 2 & 1) * auVar30._40_4_;
          auVar37._44_4_ = (uint)(bVar9 >> 3 & 1) * auVar30._44_4_;
          auVar37._48_4_ = (uint)(bVar9 >> 4 & 1) * auVar30._48_4_;
          auVar37._52_4_ = (uint)(bVar9 >> 5 & 1) * auVar30._52_4_;
          auVar37._56_4_ = (uint)(bVar9 >> 6 & 1) * auVar30._56_4_;
          auVar37._60_4_ = (uint)(bVar9 >> 7) * auVar30._60_4_;
          uVar15 = uVar15 + 0x10;
          auVar30 = vpmulld_avx512f(auVar37,auVar33);
        } while (uVar16 != uVar15);
        auVar30 = vmovdqa32_avx512f(auVar30);
        auVar38._0_4_ = (uint)(bVar8 & 1) * auVar30._0_4_ | (uint)!(bool)(bVar8 & 1) * auVar33._0_4_
        ;
        bVar4 = (bool)((byte)(uVar24 >> 1) & 1);
        auVar38._4_4_ = (uint)bVar4 * auVar30._4_4_ | (uint)!bVar4 * auVar33._4_4_;
        bVar4 = (bool)((byte)(uVar24 >> 2) & 1);
        auVar38._8_4_ = (uint)bVar4 * auVar30._8_4_ | (uint)!bVar4 * auVar33._8_4_;
        bVar4 = (bool)((byte)(uVar24 >> 3) & 1);
        auVar38._12_4_ = (uint)bVar4 * auVar30._12_4_ | (uint)!bVar4 * auVar33._12_4_;
        bVar4 = (bool)((byte)(uVar24 >> 4) & 1);
        auVar38._16_4_ = (uint)bVar4 * auVar30._16_4_ | (uint)!bVar4 * auVar33._16_4_;
        bVar4 = (bool)((byte)(uVar24 >> 5) & 1);
        auVar38._20_4_ = (uint)bVar4 * auVar30._20_4_ | (uint)!bVar4 * auVar33._20_4_;
        bVar4 = (bool)((byte)(uVar24 >> 6) & 1);
        auVar38._24_4_ = (uint)bVar4 * auVar30._24_4_ | (uint)!bVar4 * auVar33._24_4_;
        bVar4 = (bool)((byte)(uVar24 >> 7) & 1);
        auVar38._28_4_ = (uint)bVar4 * auVar30._28_4_ | (uint)!bVar4 * auVar33._28_4_;
        auVar38._32_4_ =
             (uint)(bVar9 & 1) * auVar30._32_4_ | (uint)!(bool)(bVar9 & 1) * auVar33._32_4_;
        bVar4 = (bool)(bVar9 >> 1 & 1);
        auVar38._36_4_ = (uint)bVar4 * auVar30._36_4_ | (uint)!bVar4 * auVar33._36_4_;
        bVar4 = (bool)(bVar9 >> 2 & 1);
        auVar38._40_4_ = (uint)bVar4 * auVar30._40_4_ | (uint)!bVar4 * auVar33._40_4_;
        bVar4 = (bool)(bVar9 >> 3 & 1);
        auVar38._44_4_ = (uint)bVar4 * auVar30._44_4_ | (uint)!bVar4 * auVar33._44_4_;
        bVar4 = (bool)(bVar9 >> 4 & 1);
        auVar38._48_4_ = (uint)bVar4 * auVar30._48_4_ | (uint)!bVar4 * auVar33._48_4_;
        bVar4 = (bool)(bVar9 >> 5 & 1);
        auVar38._52_4_ = (uint)bVar4 * auVar30._52_4_ | (uint)!bVar4 * auVar33._52_4_;
        bVar4 = (bool)(bVar9 >> 6 & 1);
        auVar38._56_4_ = (uint)bVar4 * auVar30._56_4_ | (uint)!bVar4 * auVar33._56_4_;
        auVar38._60_4_ =
             (uint)(bVar9 >> 7) * auVar30._60_4_ | (uint)!(bool)(bVar9 >> 7) * auVar33._60_4_;
        auVar25 = vextracti64x4_avx512f(auVar38,1);
        auVar30 = vpmulld_avx512f(auVar38,ZEXT3264(auVar25));
        auVar5 = vpmulld_avx(auVar30._0_16_,auVar30._16_16_);
        auVar6 = vpshufd_avx(auVar5,0xee);
        auVar5 = vpmulld_avx(auVar5,auVar6);
        auVar6 = vpshufd_avx(auVar5,0x55);
        auVar5 = vpmulld_avx(auVar5,auVar6);
        auVar27 = vmovdqa64_avx512f(auVar27);
        uVar15 = 0;
        do {
          auVar30 = vpbroadcastq_avx512f();
          auVar32 = vmovdqa64_avx512f(auVar27);
          auVar27 = vporq_avx512f(auVar30,auVar28);
          auVar30 = vporq_avx512f(auVar30,auVar29);
          uVar7 = vpcmpuq_avx512f(auVar30,auVar31,2);
          bVar8 = (byte)uVar7;
          uVar7 = vpcmpuq_avx512f(auVar27,auVar31,2);
          bVar9 = (byte)uVar7;
          uVar24 = CONCAT11(bVar9,bVar8);
          auVar27 = vmovdqu32_avx512f(*(undefined1 (*) [64])((pTVar2->d).d + uVar15));
          auVar30._4_4_ = (uint)((byte)(uVar24 >> 1) & 1) * auVar27._4_4_;
          auVar30._0_4_ = (uint)(bVar8 & 1) * auVar27._0_4_;
          auVar30._8_4_ = (uint)((byte)(uVar24 >> 2) & 1) * auVar27._8_4_;
          auVar30._12_4_ = (uint)((byte)(uVar24 >> 3) & 1) * auVar27._12_4_;
          auVar30._16_4_ = (uint)((byte)(uVar24 >> 4) & 1) * auVar27._16_4_;
          auVar30._20_4_ = (uint)((byte)(uVar24 >> 5) & 1) * auVar27._20_4_;
          auVar30._24_4_ = (uint)((byte)(uVar24 >> 6) & 1) * auVar27._24_4_;
          auVar30._28_4_ = (uint)((byte)(uVar24 >> 7) & 1) * auVar27._28_4_;
          auVar30._32_4_ = (uint)(bVar9 & 1) * auVar27._32_4_;
          auVar30._36_4_ = (uint)(bVar9 >> 1 & 1) * auVar27._36_4_;
          auVar30._40_4_ = (uint)(bVar9 >> 2 & 1) * auVar27._40_4_;
          auVar30._44_4_ = (uint)(bVar9 >> 3 & 1) * auVar27._44_4_;
          auVar30._48_4_ = (uint)(bVar9 >> 4 & 1) * auVar27._48_4_;
          auVar30._52_4_ = (uint)(bVar9 >> 5 & 1) * auVar27._52_4_;
          auVar30._56_4_ = (uint)(bVar9 >> 6 & 1) * auVar27._56_4_;
          auVar30._60_4_ = (uint)(bVar9 >> 7) * auVar27._60_4_;
          uVar15 = uVar15 + 0x10;
          auVar27 = vpmulld_avx512f(auVar30,auVar32);
        } while (uVar16 != uVar15);
        auVar27 = vmovdqa32_avx512f(auVar27);
        auVar39._0_4_ = (uint)(bVar8 & 1) * auVar27._0_4_ | (uint)!(bool)(bVar8 & 1) * auVar32._0_4_
        ;
        bVar4 = (bool)((byte)(uVar24 >> 1) & 1);
        auVar39._4_4_ = (uint)bVar4 * auVar27._4_4_ | (uint)!bVar4 * auVar32._4_4_;
        bVar4 = (bool)((byte)(uVar24 >> 2) & 1);
        auVar39._8_4_ = (uint)bVar4 * auVar27._8_4_ | (uint)!bVar4 * auVar32._8_4_;
        bVar4 = (bool)((byte)(uVar24 >> 3) & 1);
        auVar39._12_4_ = (uint)bVar4 * auVar27._12_4_ | (uint)!bVar4 * auVar32._12_4_;
        bVar4 = (bool)((byte)(uVar24 >> 4) & 1);
        auVar39._16_4_ = (uint)bVar4 * auVar27._16_4_ | (uint)!bVar4 * auVar32._16_4_;
        bVar4 = (bool)((byte)(uVar24 >> 5) & 1);
        auVar39._20_4_ = (uint)bVar4 * auVar27._20_4_ | (uint)!bVar4 * auVar32._20_4_;
        bVar4 = (bool)((byte)(uVar24 >> 6) & 1);
        auVar39._24_4_ = (uint)bVar4 * auVar27._24_4_ | (uint)!bVar4 * auVar32._24_4_;
        bVar4 = (bool)((byte)(uVar24 >> 7) & 1);
        auVar39._28_4_ = (uint)bVar4 * auVar27._28_4_ | (uint)!bVar4 * auVar32._28_4_;
        auVar39._32_4_ =
             (uint)(bVar9 & 1) * auVar27._32_4_ | (uint)!(bool)(bVar9 & 1) * auVar32._32_4_;
        bVar4 = (bool)(bVar9 >> 1 & 1);
        auVar39._36_4_ = (uint)bVar4 * auVar27._36_4_ | (uint)!bVar4 * auVar32._36_4_;
        bVar4 = (bool)(bVar9 >> 2 & 1);
        auVar39._40_4_ = (uint)bVar4 * auVar27._40_4_ | (uint)!bVar4 * auVar32._40_4_;
        bVar4 = (bool)(bVar9 >> 3 & 1);
        auVar39._44_4_ = (uint)bVar4 * auVar27._44_4_ | (uint)!bVar4 * auVar32._44_4_;
        bVar4 = (bool)(bVar9 >> 4 & 1);
        auVar39._48_4_ = (uint)bVar4 * auVar27._48_4_ | (uint)!bVar4 * auVar32._48_4_;
        bVar4 = (bool)(bVar9 >> 5 & 1);
        auVar39._52_4_ = (uint)bVar4 * auVar27._52_4_ | (uint)!bVar4 * auVar32._52_4_;
        bVar4 = (bool)(bVar9 >> 6 & 1);
        auVar39._56_4_ = (uint)bVar4 * auVar27._56_4_ | (uint)!bVar4 * auVar32._56_4_;
        auVar39._60_4_ =
             (uint)(bVar9 >> 7) * auVar27._60_4_ | (uint)!(bool)(bVar9 >> 7) * auVar32._60_4_;
        auVar25 = vextracti64x4_avx512f(auVar39,1);
        uVar12 = ((uVar23 + 2) % uVar14) * auVar5._0_4_;
        auVar27 = vpmulld_avx512f(auVar39,ZEXT3264(auVar25));
        auVar5 = vpmulld_avx(auVar27._0_16_,auVar27._16_16_);
        auVar6 = vpshufd_avx(auVar5,0xee);
        auVar5 = vpmulld_avx(auVar5,auVar6);
        auVar6 = vpshufd_avx(auVar5,0x55);
        auVar5 = vpmulld_avx(auVar5,auVar6);
        iVar41 = auVar5._0_4_;
      }
      local_78 = local_48 + uVar11;
      local_60 = local_48 + uVar12;
      local_90 = local_48 + (uVar23 % uVar14) * iVar40;
      local_48 = local_48 + ((uVar23 + 3) % uVar14) * iVar41;
      local_68.m_value = local_80.m_value;
      local_50.m_value = local_80.m_value;
      local_38.m_value = local_80.m_value;
      if ((local_110.
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_rows.m_value != local_80.m_value) ||
         (local_110.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_cols.m_value != (ulong)uVar17)) {
        __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, -1>>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, -1>>, const Eigen::Map<Eigen::Matrix<float, -1, -1>>>, const Eigen::Map<Eigen::Matrix<float, -1, -1>>>, const Eigen::Map<Eigen::Matrix<float, -1, -1>>>, Functor = Eigen::internal::add_assign_op<float, float>]"
                     );
      }
      local_e0.m_dst = &local_c0;
      local_e0.m_src = (SrcEvaluatorType *)local_a8;
      local_e0.m_functor = &local_11d;
      local_e0.m_dstExpr = &local_110;
      local_c0.
      super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>
      .m_data = local_110.
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_data;
      local_c0.
      super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>
      .m_outerStride.m_value = local_80.m_value;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>_>,_Eigen::internal::add_assign_op<float,_float>,_0>,_3,_0>
      ::run(&local_e0);
      auVar27 = vpbroadcastd_avx512f(ZEXT416(1));
      auVar28 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar29 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      uVar23 = uVar23 + 4;
    } while (uVar23 < local_11c);
  }
  return;
}

Assistant:

void SumBatches::backward_impl(const vector<const Tensor*>& xs,
                     const Tensor& fx,
                     const Tensor& dEdf,
                     unsigned i,
                     Tensor& dEdxi) const {
  assert(i == 0);
#if HAVE_CUDA
  for (unsigned i = 0; i < dEdxi.d.bd; ++i)
    CUBLAS_CHECK(cublasSaxpy(cublas_handle, fx.d.size(), kSCALAR_ONE, dEdf.v, 1, dEdxi.v + i * dEdxi.d.batch_size(), 1));
#else
  for (unsigned i = 0; i < dEdxi.d.bd; ++i)
    dEdxi.batch_matrix(i) += *dEdf;
#endif
}